

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>::
emplace<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>const&>
          (QGenericArrayOps<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>> *this,qsizetype i,
          pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *args)

{
  long lVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  Inserter local_98;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int **)this != (int *)0x0) && (**(int **)this < 2)) {
    if (*(long *)(this + 0x10) == i) {
      qVar2 = QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::
              freeSpaceAtEnd((QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>
                              *)this);
      if (qVar2 == 0) goto LAB_001ee17d;
      std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::pair
                ((pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)
                 (*(long *)(this + 0x10) * 0x18 + *(long *)(this + 8)),args);
LAB_001ee28e:
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      goto LAB_001ee24d;
    }
LAB_001ee17d:
    if (i == 0) {
      qVar2 = QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::
              freeSpaceAtBegin((QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>
                                *)this);
      if (qVar2 != 0) {
        std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::pair
                  ((pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)(*(long *)(this + 8) + -0x18),
                   args);
        *(long *)(this + 8) = *(long *)(this + 8) + -0x18;
        goto LAB_001ee28e;
      }
    }
  }
  local_48.second = (QHttpNetworkReply *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_48.first.d.d.ptr =
       (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
  std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::pair(&local_48,args);
  lVar1 = *(long *)(this + 0x10);
  QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)this,
             (uint)(i == 0 && lVar1 != 0),1,(pair<QHttpNetworkRequest,_QHttpNetworkReply_*> **)0x0,
             (QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x0);
  if (i == 0 && lVar1 != 0) {
    std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::pair
              ((pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)(*(long *)(this + 8) + -0x18),
               &local_48);
    *(long *)(this + 8) = *(long *)(this + 8) + -0x18;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  else {
    local_98.sourceCopyConstruct = 0;
    local_98.nSource = 0;
    local_98.move = 0;
    local_98.sourceCopyAssign = 0;
    local_98.end = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0x0;
    local_98.last = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0x0;
    local_98.where = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0x0;
    local_98.begin = *(pair<QHttpNetworkRequest,_QHttpNetworkReply_*> **)(this + 8);
    local_98.size = *(qsizetype *)(this + 0x10);
    local_98.data = (QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)this;
    QGenericArrayOps<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::Inserter::insertOne
              (&local_98,i,&local_48);
    (local_98.data)->ptr = local_98.begin;
    (local_98.data)->size = local_98.size;
  }
  QHttpNetworkRequest::~QHttpNetworkRequest(&local_48.first);
LAB_001ee24d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }